

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VRINTR_sp(DisasContext_conflict1 *s,arg_VRINTR_sp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 var;
  TCGv_ptr arg2;
  TCGv_i32 tmp;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  arg_VRINTR_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_vrint(s->isar);
  if (_Var1) {
    _Var1 = vfp_access_check(s);
    if (_Var1) {
      var = tcg_temp_new_i32(tcg_ctx_00);
      neon_load_reg32(tcg_ctx_00,var,a->vm);
      arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
      gen_helper_rints(tcg_ctx_00,var,var,arg2);
      neon_store_reg32(tcg_ctx_00,var,a->vd);
      tcg_temp_free_ptr(tcg_ctx_00,arg2);
      tcg_temp_free_i32(tcg_ctx_00,var);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VRINTR_sp(DisasContext *s, arg_VRINTR_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i32 tmp;

    if (!dc_isar_feature(aa32_vrint, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg32(tcg_ctx, tmp, a->vm);
    fpst = get_fpstatus_ptr(tcg_ctx, false);
    gen_helper_rints(tcg_ctx, tmp, tmp, fpst);
    neon_store_reg32(tcg_ctx, tmp, a->vd);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
    return true;
}